

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_shader.h
# Opt level: O2

GLuint s_loadProgram(char *vp,char *fp,char **attributes,int attributeCount)

{
  GLint GVar1;
  GLuint GVar2;
  GLuint GVar3;
  GLuint GVar4;
  GLchar *__ptr;
  ulong uVar5;
  ulong uVar6;
  GLint infoLen;
  GLint linked;
  
  GVar2 = s_loadShader(0x8b31,vp);
  GVar4 = 0;
  if (GVar2 != 0) {
    GVar3 = s_loadShader(0x8b30,fp);
    if (GVar3 == 0) {
      (*glad_glDeleteShader)(GVar2);
      GVar4 = 0;
    }
    else {
      GVar4 = (*glad_glCreateProgram)();
      if (GVar4 == 0) {
        fwrite("Could not create program!\n",0x1a,1,_stderr);
        GVar4 = 0;
      }
      else {
        (*glad_glAttachShader)(GVar4,GVar2);
        (*glad_glAttachShader)(GVar4,GVar3);
        uVar5 = 0;
        uVar6 = (ulong)(uint)attributeCount;
        if (attributeCount < 1) {
          uVar6 = uVar5;
        }
        for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
          (*glad_glBindAttribLocation)(GVar4,(GLuint)uVar5,attributes[uVar5]);
        }
        (*glad_glLinkProgram)(GVar4);
        (*glad_glDeleteShader)(GVar2);
        (*glad_glDeleteShader)(GVar3);
        (*glad_glGetProgramiv)(GVar4,0x8b82,&linked);
        if (linked == 0) {
          fwrite("Could not link program!\n",0x18,1,_stderr);
          infoLen = 0;
          (*glad_glGetProgramiv)(GVar4,0x8b84,&infoLen);
          GVar1 = infoLen;
          if ((long)infoLen != 0) {
            __ptr = (GLchar *)malloc((long)infoLen);
            (*glad_glGetProgramInfoLog)(GVar4,GVar1,(GLsizei *)0x0,__ptr);
            fprintf(_stderr,"%s\n",__ptr);
            free(__ptr);
          }
          (*glad_glDeleteProgram)(GVar4);
          GVar4 = 0;
        }
      }
    }
  }
  return GVar4;
}

Assistant:

static GLuint s_loadProgram(const char *vp, const char *fp, const char **attributes, int attributeCount)
{
	GLuint vertexShader = s_loadShader(GL_VERTEX_SHADER, vp);
	if (!vertexShader)
		return 0;
	GLuint fragmentShader = s_loadShader(GL_FRAGMENT_SHADER, fp);
	if (!fragmentShader)
	{
		glDeleteShader(vertexShader);
		return 0;
	}

	GLuint program = glCreateProgram();
	if (program == 0)
	{
		fprintf(stderr, "Could not create program!\n");
		return 0;
	}
	glAttachShader(program, vertexShader);
	glAttachShader(program, fragmentShader);
    
    for (int i = 0; i < attributeCount; i++)
        glBindAttribLocation(program, i, attributes[i]);
    
	glLinkProgram(program);
	glDeleteShader(vertexShader);
	glDeleteShader(fragmentShader);
	GLint linked;
	glGetProgramiv(program, GL_LINK_STATUS, &linked);
	if (!linked)
	{
		fprintf(stderr, "Could not link program!\n");
		GLint infoLen = 0;
		glGetProgramiv(program, GL_INFO_LOG_LENGTH, &infoLen);
		if (infoLen)
		{
			char* infoLog = (char*)malloc(sizeof(char) * infoLen);
			glGetProgramInfoLog(program, infoLen, NULL, infoLog);
			fprintf(stderr, "%s\n", infoLog);
			free(infoLog);
		}
		glDeleteProgram(program);
		return 0;
	}
	return program;
}